

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_listsearch_resp(Curl_easy *data,int imapcode,imapstate instate)

{
  char *buf;
  size_t len;
  char *line;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  Curl_easy *data_local;
  
  line._4_4_ = CURLE_OK;
  buf = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  if (imapcode == 0x2a) {
    line._4_4_ = Curl_client_write(data,1,buf,(data->conn->proto).ftpc.pp.nfinal);
  }
  else if (imapcode == 1) {
    imap_state(data,IMAP_STOP);
  }
  else {
    line._4_4_ = CURLE_QUOTE_ERROR;
  }
  return line._4_4_;
}

Assistant:

static CURLcode imap_state_listsearch_resp(struct Curl_easy *data,
                                           int imapcode,
                                           imapstate instate)
{
  CURLcode result = CURLE_OK;
  char *line = Curl_dyn_ptr(&data->conn->proto.imapc.pp.recvbuf);
  size_t len = data->conn->proto.imapc.pp.nfinal;

  (void)instate; /* No use for this yet */

  if(imapcode == '*')
    result = Curl_client_write(data, CLIENTWRITE_BODY, line, len);
  else if(imapcode != IMAP_RESP_OK)
    result = CURLE_QUOTE_ERROR;
  else
    /* End of DO phase */
    imap_state(data, IMAP_STOP);

  return result;
}